

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

void __thiscall
Js::DynamicProfileInfo::RecordPolymorphicCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,
          FunctionInfo *calleeFunctionInfo)

{
  FunctionProxy *this_00;
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  ScriptContext *pSVar4;
  DWORD_PTR DVar5;
  DWORD_PTR DVar6;
  undefined4 *puVar7;
  SourceId curSourceId;
  LocalFunctionId functionId;
  
  if ((calleeFunctionInfo == (FunctionInfo *)0x0) ||
     (this_00 = (calleeFunctionInfo->functionBodyImpl).ptr, this_00 == (FunctionProxy *)0x0)) {
    functionId = 0xffffffff;
  }
  else {
    pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    pSVar4 = FunctionProxy::GetScriptContext(this_00);
    if (pSVar3 == pSVar4) {
      DVar5 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)functionBody);
      DVar6 = FunctionProxy::GetSecondaryHostSourceContext(this_00);
      if (DVar5 == DVar6) {
        DVar5 = FunctionProxy::GetHostSourceContext(this_00);
        DVar6 = FunctionProxy::GetHostSourceContext((FunctionProxy *)functionBody);
        curSourceId = 0xfffffffd;
        if (DVar6 != (DVar5 & 0xffffffff)) {
          curSourceId = (SourceId)DVar5;
        }
        if ((this_00->functionInfo).ptr == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
        }
        SetFunctionIdSlotForNewPolymorphicCall
                  (this,callSiteId,((this_00->functionInfo).ptr)->functionId,curSourceId,
                   functionBody);
        return;
      }
    }
    functionId = 0xfffffffe;
  }
  ResetPolymorphicCallSiteInfo(this,callSiteId,functionId);
  return;
}

Assistant:

void DynamicProfileInfo::RecordPolymorphicCallSiteInfo(FunctionBody* functionBody, ProfileId callSiteId, FunctionInfo * calleeFunctionInfo)
    {
        Js::LocalFunctionId functionId;
        if (calleeFunctionInfo == nullptr || !calleeFunctionInfo->HasBody())
        {
            return ResetPolymorphicCallSiteInfo(callSiteId, CallSiteMixed);
        }

        // We can only inline function that are from the same script context. So only record that data
        // We're about to call this function so deserialize it right now.
        FunctionProxy* calleeFunctionProxy = calleeFunctionInfo->GetFunctionProxy();

        if (functionBody->GetScriptContext() == calleeFunctionProxy->GetScriptContext())
        {
            if (functionBody->GetSecondaryHostSourceContext() == calleeFunctionProxy->GetSecondaryHostSourceContext())
            {
                Js::SourceId sourceId = (Js::SourceId)calleeFunctionProxy->GetHostSourceContext();
                if (functionBody->GetHostSourceContext() == sourceId)  // if caller and callee in same file
                {
                    sourceId = CurrentSourceId;
                }
                functionId = calleeFunctionProxy->GetLocalFunctionId();
                SetFunctionIdSlotForNewPolymorphicCall(callSiteId, functionId, sourceId, functionBody);
                return;
            }
        }

        // Pretend that we are cross context when call is crossing script file.
        ResetPolymorphicCallSiteInfo(callSiteId, CallSiteCrossContext);
    }